

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.cc
# Opt level: O0

void __thiscall
leveldb::CacheTest_EvictionPolicy_Test::CacheTest_EvictionPolicy_Test
          (CacheTest_EvictionPolicy_Test *this)

{
  CacheTest_EvictionPolicy_Test *this_local;
  
  CacheTest::CacheTest(&this->super_CacheTest);
  (this->super_CacheTest).super_Test._vptr_Test =
       (_func_int **)&PTR__CacheTest_EvictionPolicy_Test_00181bd0;
  return;
}

Assistant:

TEST_F(CacheTest, EvictionPolicy) {
  Insert(100, 101);
  Insert(200, 201);
  Insert(300, 301);
  Cache::Handle* h = cache_->Lookup(EncodeKey(300));

  // Frequently used entry must be kept around,
  // as must things that are still in use.
  for (int i = 0; i < kCacheSize + 100; i++) {
    Insert(1000 + i, 2000 + i);
    ASSERT_EQ(2000 + i, Lookup(1000 + i));
    ASSERT_EQ(101, Lookup(100));
  }
  ASSERT_EQ(101, Lookup(100));
  ASSERT_EQ(-1, Lookup(200));
  ASSERT_EQ(301, Lookup(300));
  cache_->Release(h);
}